

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::dump(Builder *this,Vector<unsigned_int> *out)

{
  pointer ppcVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  Builder *pBVar4;
  long lVar5;
  Instruction memInst;
  Instruction sourceExtInst;
  undefined1 local_a0 [56];
  undefined1 local_68 [16];
  _Rb_tree_color local_58;
  _Alloc_hider local_50;
  _Base_ptr p_Stack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  local_40;
  
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (out,&MagicNumber);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back(out,&Version);
  local_a0._0_4_ = this->builderNumber;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(out,(uint *)local_a0);
  local_a0._0_4_ = this->uniqueId + 1;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(out,(uint *)local_a0);
  local_a0._0_8_ = (ulong)(uint)local_a0._4_4_ << 0x20;
  pBVar3 = (Builder *)out;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(out,(uint *)local_a0);
  pBVar4 = (Builder *)(this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pBVar4 != (Builder *)&(this->capabilities)._M_t._M_impl.super__Rb_tree_header) {
    local_a0._0_8_ = &PTR__Instruction_001e31e0;
    local_a0._8_4_ = SourceLanguageUnknown;
    local_a0._12_4_ = 0;
    local_a0._16_4_ = OpCapability;
    local_a0._40_8_ = (pointer)0x0;
    local_a0._48_8_ = (Block *)0x0;
    local_a0._24_8_ = (pointer)0x0;
    local_a0._32_8_ = (pointer)0x0;
    Instruction::addImmediateOperand
              ((Instruction *)local_a0,(uint)(pBVar4->sourceText)._M_string_length);
    Instruction::dump((Instruction *)local_a0,out);
    Instruction::~Instruction((Instruction *)local_a0);
    pBVar2 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar4);
    pBVar3 = pBVar4;
    pBVar4 = pBVar2;
  }
  pBVar4 = (Builder *)(this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pBVar4 != (Builder *)&(this->extensions)._M_t._M_impl.super__Rb_tree_header) {
    local_a0._0_8_ = &PTR__Instruction_001e31e0;
    local_a0._8_4_ = SourceLanguageUnknown;
    local_a0._12_4_ = 0;
    local_a0._16_4_ = OpExtension;
    local_a0._40_8_ = (pointer)0x0;
    local_a0._48_8_ = (Block *)0x0;
    local_a0._24_8_ = (pointer)0x0;
    local_a0._32_8_ = (pointer)0x0;
    Instruction::addStringOperand
              ((Instruction *)local_a0,(char *)(pBVar4->sourceText)._M_string_length);
    Instruction::dump((Instruction *)local_a0,out);
    Instruction::~Instruction((Instruction *)local_a0);
    pBVar2 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar4);
    pBVar3 = pBVar4;
    pBVar4 = pBVar2;
  }
  dumpInstructions(pBVar3,out,&this->imports);
  local_a0._0_8_ = &PTR__Instruction_001e31e0;
  local_a0._8_4_ = SourceLanguageUnknown;
  local_a0._12_4_ = 0;
  local_a0._16_4_ = OpMemoryModel;
  local_a0._24_8_ = (pointer)0x0;
  local_a0._32_8_ = (pointer)0x0;
  local_a0._40_8_ = (pointer)0x0;
  local_a0._48_8_ = (Block *)0x0;
  Instruction::addImmediateOperand((Instruction *)local_a0,this->addressModel);
  Instruction::addImmediateOperand((Instruction *)local_a0,this->memoryModel);
  pBVar3 = (Builder *)local_a0;
  Instruction::dump((Instruction *)pBVar3,out);
  dumpInstructions(pBVar3,out,&this->entryPoints);
  dumpInstructions(pBVar3,out,&this->executionModes);
  dumpInstructions(pBVar3,out,&this->strings);
  dumpModuleProcesses(this,out);
  pBVar3 = this;
  dumpSourceInstructions(this,out);
  for (lVar5 = 0;
      ppcVar1 = (this->sourceExtensions).
                super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar5 < (int)((ulong)((long)(this->sourceExtensions).
                                  super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1) >> 3);
      lVar5 = lVar5 + 1) {
    local_68._0_8_ = &PTR__Instruction_001e31e0;
    local_68._8_8_ = 0;
    local_58 = 4;
    local_40._M_allocated_capacity = 0;
    local_40._8_8_ = 0;
    local_50._M_p = (pointer)0x0;
    p_Stack_48 = (_Base_ptr)0x0;
    Instruction::addStringOperand((Instruction *)local_68,ppcVar1[lVar5]);
    Instruction::dump((Instruction *)local_68,out);
    pBVar3 = (Builder *)local_68;
    Instruction::~Instruction((Instruction *)local_68);
  }
  dumpInstructions(pBVar3,out,&this->names);
  dumpInstructions(pBVar3,out,&this->lines);
  dumpInstructions(pBVar3,out,&this->decorations);
  dumpInstructions(pBVar3,out,&this->constantsTypesGlobals);
  dumpInstructions(pBVar3,out,&this->externals);
  Module::dump(&this->module,out);
  Instruction::~Instruction((Instruction *)local_a0);
  return;
}

Assistant:

void Builder::dump(dxil_spv::Vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(Version);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpModuleProcesses(out);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpInstructions(out, lines);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}